

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpstream.cpp
# Opt level: O1

void __thiscall TCPStream::TCPStream(TCPStream *this,int sd,sockaddr_in *address)

{
  char *pcVar1;
  char ip [50];
  char acStack_68 [56];
  
  this->m_sd = sd;
  (this->m_peerIP)._M_dataplus._M_p = (pointer)&(this->m_peerIP).field_2;
  (this->m_peerIP)._M_string_length = 0;
  (this->m_peerIP).field_2._M_local_buf[0] = '\0';
  inet_ntop(2,&address->sin_addr,acStack_68,0x31);
  pcVar1 = (char *)(this->m_peerIP)._M_string_length;
  strlen(acStack_68);
  std::__cxx11::string::_M_replace((ulong)&this->m_peerIP,0,pcVar1,(ulong)acStack_68);
  this->m_peerPort = (uint)(ushort)(address->sin_port << 8 | address->sin_port >> 8);
  return;
}

Assistant:

TCPStream::TCPStream(int sd, struct sockaddr_in* address) : m_sd(sd) {
    char ip[50];
    inet_ntop(PF_INET, (struct in_addr*)&(address->sin_addr.s_addr), ip, sizeof(ip)-1);
    m_peerIP = ip;
    m_peerPort = ntohs(address->sin_port);
}